

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O2

void __thiscall Dice::showResolvedHand(Dice *this)

{
  int iVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  char **ppcVar4;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Current resolved items -------");
  std::endl<char,std::char_traits<char>>(poVar2);
  p_Var3 = (this->resolvedHand)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ppcVar4 = this->DiceNames;
  while ((_Rb_tree_header *)p_Var3 != &(this->resolvedHand)._M_t._M_impl.super__Rb_tree_header) {
    iVar1 = *(int *)&p_Var3[1].field_0x4;
    poVar2 = std::operator<<((ostream *)&std::cout,*ppcVar4);
    poVar2 = std::operator<<(poVar2," : ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    ppcVar4 = ppcVar4 + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"----------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Dice::showResolvedHand() {
    int index = 0;
    cout << "Current resolved items -------" << endl;
    for (auto hand : resolvedHand) {
        cout << DiceNames[index] << " : " << hand.second << endl;
        index++;
    }
    cout << "----------------------------" << endl;

}